

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CGL::OSDText::set_text(OSDText *this,int line_id,string *text)

{
  bool bVar1;
  pointer pOVar2;
  __normal_iterator<CGL::OSDLine_*,_std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>_>
  local_30;
  __normal_iterator<CGL::OSDLine_*,_std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>_>
  local_28;
  iterator it;
  string *text_local;
  int line_id_local;
  OSDText *this_local;
  
  it._M_current = (OSDLine *)text;
  local_28._M_current =
       (OSDLine *)std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::begin(&this->lines);
  while( true ) {
    local_30._M_current =
         (OSDLine *)std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::end(&this->lines);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CGL::OSDLine_*,_std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>_>
             ::operator->(&local_28);
    if (pOVar2->id == line_id) break;
    __gnu_cxx::
    __normal_iterator<CGL::OSDLine_*,_std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>_>::
    operator++(&local_28);
  }
  pOVar2 = __gnu_cxx::
           __normal_iterator<CGL::OSDLine_*,_std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>_>
           ::operator->(&local_28);
  std::__cxx11::string::operator=((string *)&pOVar2->text,(string *)text);
  return;
}

Assistant:

void OSDText::set_text(int line_id, string text) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->text = text;
      break;
    }
    ++it;
  }
}